

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O2

LinkedSymbol __thiscall
HuffmanTable::getLeastWeightLinkedSymbol
          (HuffmanTable *this,vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *symbols)

{
  pointer pLVar1;
  Symbol *pSVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pLVar9;
  uint uVar10;
  LinkedSymbol LVar11;
  
  pLVar1 = (symbols->super__Vector_base<LinkedSymbol,_std::allocator<LinkedSymbol>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(symbols->super__Vector_base<LinkedSymbol,_std::allocator<LinkedSymbol>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pLVar1 >> 4;
  uVar4 = uVar6 - 1;
  uVar8 = uVar6;
  uVar5 = pLVar1[uVar6 - 1].weight;
  do {
    uVar10 = uVar5;
    uVar7 = uVar4;
    LVar11._4_4_ = 0;
    LVar11.weight = uVar10;
    pLVar9 = pLVar1 + (uVar8 - 1);
    do {
      uVar8 = uVar8 - 1;
      if (uVar6 <= uVar8) {
        pSVar2 = pLVar1[uVar7].symbol;
        std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>::erase(symbols,pLVar1 + uVar7);
        LVar11.symbol = pSVar2;
        return LVar11;
      }
      puVar3 = &pLVar9->weight;
      pLVar9 = pLVar9 + -1;
      uVar4 = uVar8;
      uVar5 = *puVar3;
    } while (uVar10 <= *puVar3);
  } while( true );
}

Assistant:

LinkedSymbol getLeastWeightLinkedSymbol(std::vector<LinkedSymbol>& symbols) {
            std::vector<LinkedSymbol>::size_type index = symbols.size() - 1;
            auto minWeight = symbols[index];
            //从底部开始循环
            for(auto i = symbols.size() - 1; i < symbols.size(); i--) {
                if(symbols[i].weight >= minWeight.weight) continue;
                minWeight = symbols[i];
                index = i;
            }
            symbols.erase(symbols.begin() + index);
            return minWeight;
    }